

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpris-player.c
# Opt level: O3

gdouble media_player2_player_proxy_get_volume(MediaPlayer2Player *object)

{
  GType GVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  long lVar4;
  gdouble gVar5;
  
  GVar1 = media_player2_player_proxy_get_type();
  uVar2 = g_type_check_instance_cast(object,GVar1);
  uVar3 = g_dbus_proxy_get_type();
  uVar2 = g_type_check_instance_cast(uVar2,uVar3);
  lVar4 = g_dbus_proxy_get_cached_property(uVar2,"Volume");
  if (lVar4 == 0) {
    gVar5 = 0.0;
  }
  else {
    gVar5 = (gdouble)g_variant_get_double(lVar4);
    g_variant_unref(lVar4);
  }
  return gVar5;
}

Assistant:

static gdouble 
media_player2_player_proxy_get_volume (MediaPlayer2Player *object)
{
  MediaPlayer2PlayerProxy *proxy = MEDIA_PLAYER2_PLAYER_PROXY (object);
  GVariant *variant;
  gdouble value = 0;
  variant = g_dbus_proxy_get_cached_property (G_DBUS_PROXY (proxy), "Volume");
  if (variant != NULL)
    {
      value = g_variant_get_double (variant);
      g_variant_unref (variant);
    }
  return value;
}